

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall gimage::Histogram::convertToImage(Histogram *this,ImageFloat *image)

{
  int iVar1;
  uint uVar2;
  float ***pppfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  lVar6 = (long)*(int *)(this + 4);
  if (lVar6 < 1) {
    uVar9 = 0;
  }
  else {
    lVar7 = 0;
    uVar9 = 0;
    do {
      if (0 < (int)*(uint *)this) {
        uVar8 = 0;
        do {
          uVar9 = uVar9 + *(long *)(*(long *)(*(long *)(this + 0x18) + lVar7 * 8) + uVar8 * 8);
          uVar8 = uVar8 + 1;
        } while (*(uint *)this != uVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6);
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(image,(long)*(int *)this,lVar6,1);
  if ((uVar9 != 0) && (iVar1 = *(int *)(this + 4), 0 < (long)iVar1)) {
    uVar2 = *(uint *)this;
    lVar6 = *(long *)(this + 0x18);
    pppfVar3 = image->img;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar4 = *(long *)(lVar6 + lVar7 * 8);
        pfVar5 = (*pppfVar3)[lVar7];
        uVar8 = 0;
        do {
          pfVar5[uVar8] = (float)*(ulong *)(lVar4 + uVar8 * 8) / (float)uVar9;
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void Histogram::convertToImage(ImageFloat &image) const
{
  float total=static_cast<float>(sumAll());

  image.setSize(w, h, 1);

  if (total > 0)
  {
    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, row[k][i]/total);
      }
    }
  }
}